

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

resp_data * __thiscall
async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::awaitResume
          (LazyAwaiterBase<cinatra::resp_data> *this)

{
  resp_data *__src;
  coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::resp_data>_> *in_RSI;
  resp_data *in_RDI;
  resp_data r;
  undefined1 local_40 [16];
  LazyPromise<cinatra::resp_data> *in_stack_ffffffffffffffd0;
  
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::resp_data>_>::promise
            (in_RSI);
  __src = LazyPromise<cinatra::resp_data>::result(in_stack_ffffffffffffffd0);
  memcpy(local_40,__src,0x38);
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::resp_data>_>::destroy
            ((coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::resp_data>_> *)
             0x2fba84);
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::resp_data>_>::operator=
            (in_RSI,(nullptr_t)0x0);
  memcpy(in_RDI,local_40,0x38);
  return in_RDI;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }